

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O3

int X509_check_purpose(X509 *x,int id,int ca)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  iVar1 = x509v3_cache_extensions((X509 *)x);
  if (iVar1 != 0) {
    if (id == -1) {
      return 1;
    }
    lVar2 = 0;
    do {
      if (*(int *)((long)&xstandard[0].purpose + lVar2) == id) {
        if (id != 7 && ca != 0) {
          uVar3 = (x->ex_data).dummy;
          if (((uVar3 & 2) != 0) && (((x->ex_data).field_0xc & 4) == 0)) {
            return 0;
          }
          uVar3 = ~uVar3;
          if ((uVar3 & 0x2040) != 0 && (uVar3 & 0x11) != 0) {
            return 0;
          }
        }
        iVar1 = (**(code **)((long)&xstandard[0].check_purpose + lVar2))
                          ((long)&xstandard[0].purpose + lVar2,x,ca);
        return iVar1;
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0xd8);
  }
  return 0;
}

Assistant:

int X509_check_purpose(X509 *x, int id, int ca) {
  // This differs from OpenSSL, which uses -1 to indicate a fatal error and 0 to
  // indicate an invalid certificate. BoringSSL uses 0 for both.
  if (!x509v3_cache_extensions(x)) {
    return 0;
  }

  if (id == -1) {
    return 1;
  }
  const X509_PURPOSE *pt = X509_PURPOSE_get0(id);
  if (pt == NULL) {
    return 0;
  }
  // Historically, |check_purpose| implementations other than |X509_PURPOSE_ANY|
  // called |check_ca|. This is redundant with the |X509_V_ERR_INVALID_CA|
  // logic, but |X509_check_purpose| is public API, so we preserve this
  // behavior.
  if (ca && id != X509_PURPOSE_ANY && !check_ca(x)) {
    return 0;
  }
  return pt->check_purpose(pt, x, ca);
}